

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intermission.cpp
# Opt level: O2

void __thiscall DIntermissionController::Ticker(DIntermissionController *this)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  DIntermissionScreen *pDVar4;
  
  if (this->mAdvance == true) {
    this->mSentAdvance = false;
  }
  pDVar4 = GC::ReadBarrier<DIntermissionScreen>((DIntermissionScreen **)&this->mScreen);
  if (pDVar4 == (DIntermissionScreen *)0x0) {
    bVar1 = this->mAdvance;
  }
  else {
    pDVar4 = GC::ReadBarrier<DIntermissionScreen>((DIntermissionScreen **)&this->mScreen);
    iVar3 = (*(pDVar4->super_DObject)._vptr_DObject[9])(pDVar4);
    bVar1 = iVar3 == -1 | this->mAdvance;
    this->mAdvance = (bool)bVar1;
  }
  if ((bVar1 & 1) != 0) {
    this->mAdvance = false;
    bVar2 = NextPage(this);
    if (bVar2) {
      return;
    }
    if (this->mGameState == '\x01') {
      gameaction = ga_worlddone;
    }
    else {
      if (this->mGameState != '\x02') {
        return;
      }
      if ((level.cdtrack == 0) || (bVar2 = S_ChangeCDMusic(level.cdtrack,level.cdid,true), !bVar2))
      {
        S_ChangeMusic(level.Music.Chars,level.musicorder,true,false);
      }
      gamestate = GS_LEVEL;
      wipegamestate = GS_LEVEL;
      P_ResumeConversation();
      viewactive = true;
    }
    (*(this->super_DObject)._vptr_DObject[4])(this);
    return;
  }
  return;
}

Assistant:

void DIntermissionController::Ticker ()
{
	if (mAdvance)
	{
		mSentAdvance = false;
	}
	if (mScreen != NULL)
	{
		mAdvance |= (mScreen->Ticker() == -1);
	}
	if (mAdvance)
	{
		mAdvance = false;
		if (!NextPage())
		{
			switch (mGameState)
			{
			case FSTATE_InLevel:
				if (level.cdtrack == 0 || !S_ChangeCDMusic (level.cdtrack, level.cdid))
					S_ChangeMusic (level.Music, level.musicorder);
				gamestate = GS_LEVEL;
				wipegamestate = GS_LEVEL;
				P_ResumeConversation ();
				viewactive = true;
				Destroy();
				break;

			case FSTATE_ChangingLevel:
				gameaction = ga_worlddone;
				Destroy();
				break;

			default:
				break;
			}
		}
	}
}